

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_distance2(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_a8;
  double local_a0;
  double local_98;
  double local_88;
  REF_DBL t;
  REF_DBL proj2;
  REF_DBL len2;
  REF_DBL dxyz [3];
  REF_DBL dl [3];
  REF_DBL *distance_local;
  REF_DBL *xyz_local;
  REF_DBL *xyz1_local;
  REF_DBL *xyz0_local;
  
  dVar1 = *xyz1 - *xyz0;
  dVar2 = xyz1[1] - xyz0[1];
  dVar3 = xyz1[2] - xyz0[2];
  dVar4 = *xyz - *xyz0;
  dVar5 = xyz[1] - xyz0[1];
  dVar6 = xyz[2] - xyz0[2];
  dVar7 = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  local_a0 = dVar6 * dVar3 + dVar4 * dVar1 + dVar5 * dVar2;
  if (dVar7 * 1e+20 <= 0.0) {
    local_88 = -(dVar7 * 1e+20);
  }
  else {
    local_88 = dVar7 * 1e+20;
  }
  local_98 = local_a0;
  if (local_a0 <= 0.0) {
    local_98 = -local_a0;
  }
  if (local_88 <= local_98) {
    dVar1 = sqrt(dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5);
    *distance = dVar1;
  }
  else {
    local_a0 = local_a0 / dVar7;
    if (local_a0 <= 0.0) {
      local_a0 = 0.0;
    }
    if (1.0 <= local_a0) {
      local_a8 = 1.0;
    }
    else {
      local_a8 = local_a0;
    }
    dVar1 = *xyz - (local_a8 * dVar1 + *xyz0);
    dVar2 = xyz[1] - (local_a8 * dVar2 + xyz0[1]);
    dVar3 = xyz[2] - (local_a8 * dVar3 + xyz0[2]);
    dVar1 = sqrt(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
    *distance = dVar1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance2(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL dl[3], dxyz[3], len2, proj2, t;
  dl[0] = xyz1[0] - xyz0[0];
  dl[1] = xyz1[1] - xyz0[1];
  dl[2] = xyz1[2] - xyz0[2];
  dxyz[0] = xyz[0] - xyz0[0];
  dxyz[1] = xyz[1] - xyz0[1];
  dxyz[2] = xyz[2] - xyz0[2];
  len2 = ref_math_dot(dl, dl);
  proj2 = ref_math_dot(dxyz, dl);
  if (ref_math_divisible(proj2, len2)) {
    t = proj2 / len2;
    t = MAX(t, 0.0);
    t = MIN(t, 1.0);
    dxyz[0] = xyz[0] - (xyz0[0] + t * dl[0]);
    dxyz[1] = xyz[1] - (xyz0[1] + t * dl[1]);
    dxyz[2] = xyz[2] - (xyz0[2] + t * dl[2]);
    *distance = sqrt(ref_math_dot(dxyz, dxyz));
  } else { /* length zero, either endpoint */
    *distance = sqrt(ref_math_dot(dxyz, dxyz));
  }

  return REF_SUCCESS;
}